

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture(logonAtLogonStartTimeFixture *this)

{
  int64_t *piVar1;
  UtcTimeOnly *pUVar2;
  TimeRange local_c0 [8];
  TimeRange logonTime;
  undefined1 local_80 [8];
  UtcTimeOnly logonEndTime;
  UtcTimeOnly logonStartTime;
  UtcTimeOnly local_38;
  logonAtLogonStartTimeFixture *local_10;
  logonAtLogonStartTimeFixture *this_local;
  
  local_10 = this;
  anon_unknown.dwarf_2926b4::acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__logonAtLogonStartTimeFixture_0050b248;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__logonAtLogonStartTimeFixture_0050b2a0;
  FIX::UtcTimeStamp::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now);
  FIX::UtcTimeOnly::UtcTimeOnly
            (&local_38,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
              super_DateTime);
  pUVar2 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime;
  FIX::UtcTimeOnly::operator=(pUVar2,&local_38);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_38);
  FIX::DateTime::setMillisecond(&pUVar2->super_DateTime,0);
  FIX::UtcTimeOnly::UtcTimeOnly
            ((UtcTimeOnly *)&logonStartTime.super_DateTime.m_time,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
              super_DateTime);
  pUVar2 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime;
  piVar1 = &logonStartTime.super_DateTime.m_time;
  FIX::UtcTimeOnly::operator=(pUVar2,(UtcTimeOnly *)piVar1);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)piVar1);
  FIX::DateTime::setMillisecond(&pUVar2->super_DateTime,0);
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
              super_DateTime,-10);
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
              super_DateTime,10);
  FIX::UtcTimeOnly::UtcTimeOnly
            ((UtcTimeOnly *)&logonEndTime.super_DateTime.m_time,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
              super_DateTime);
  FIX::UtcTimeOnly::UtcTimeOnly
            ((UtcTimeOnly *)local_80,
             &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
              super_DateTime);
  piVar1 = &logonEndTime.super_DateTime.m_time;
  FIX::DateTime::operator+=((DateTime *)piVar1,1);
  FIX::DateTime::operator+=((DateTime *)local_80,2);
  FIX::TimeRange::TimeRange(local_c0,(UtcTimeOnly *)piVar1,(UtcTimeOnly *)local_80,-1,-1);
  FIX::Session::setLogonTime((this->super_acceptorFixture).super_sessionFixture.object,local_c0);
  FIX::TimeRange::~TimeRange(local_c0);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_80);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&logonEndTime.super_DateTime.m_time);
  return;
}

Assistant:

logonAtLogonStartTimeFixture() {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);

    endTime = now;
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime(now);
    UtcTimeOnly logonEndTime(now);
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime(logonStartTime, logonEndTime);

    object->setLogonTime(logonTime);
  }